

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableWidgetItem::QTableWidgetItem(QTableWidgetItem *this,int type)

{
  long lVar1;
  QFlags<Qt::ItemFlag> QVar2;
  QTableWidgetItemPrivate *this_00;
  int in_ESI;
  QTableWidgetItem *in_RDI;
  long in_FS_OFFSET;
  ItemFlag other;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QTableWidgetItem = (_func_int **)&PTR__QTableWidgetItem_00d304b0;
  in_RDI->rtti = in_ESI;
  QList<QWidgetItemData>::QList((QList<QWidgetItemData> *)0x8d8717);
  in_RDI->view = (QTableWidget *)0x0;
  this_00 = (QTableWidgetItemPrivate *)operator_new(0x10);
  QTableWidgetItemPrivate::QTableWidgetItemPrivate(this_00,in_RDI);
  in_RDI->d = this_00;
  Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  other = (ItemFlag)((ulong)this_00 >> 0x20);
  QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_RDI,other);
  QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_RDI,other);
  QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_RDI,other);
  QVar2 = QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_RDI,other);
  (in_RDI->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
       = (Int)QVar2.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTableWidgetItem::QTableWidgetItem(int type)
    :  rtti(type), view(nullptr), d(new QTableWidgetItemPrivate(this)),
      itemFlags(Qt::ItemIsEditable
                |Qt::ItemIsSelectable
                |Qt::ItemIsUserCheckable
                |Qt::ItemIsEnabled
                |Qt::ItemIsDragEnabled
                |Qt::ItemIsDropEnabled)
{
}